

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

uint32 cnt_class(dtree_node_t *node,uint32 *n_a,uint32 *n_b)

{
  for (; (node->y != (dtree_node_t *)0x0 || (node->n != (dtree_node_str *)0x0)); node = node->n) {
    cnt_class(node->y,n_a,n_b);
  }
  if (node->clust == 0) {
    n_a = n_b;
  }
  *n_a = *n_a + 1;
  return 0;
}

Assistant:

uint32
cnt_class(dtree_node_t *node,
	  uint32 *n_a,
	  uint32 *n_b)
{
    if (IS_LEAF(node)) {
	if (node->clust)
	    ++(*n_a);
	else
	    ++(*n_b);
    }
    else {
	cnt_class(node->y, n_a, n_b);
	cnt_class(node->n, n_a, n_b);
    }
    return 0;
}